

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::sanityCheck(Program *program,BuildSettings *settings)

{
  Module *pMVar1;
  BuildSettings *settings_local;
  Program *program_local;
  
  pMVar1 = Program::getMainProcessor(program);
  ignoreUnused<soul::Module&>(pMVar1);
  sanityCheckModules(program);
  sanityCheckAdvanceAndStreamCalls(program);
  checkConnections(program);
  checkForRecursiveFunctions(program,settings->maxStackSize);
  checkForInfiniteLoops(program);
  checkBlockParameters(program);
  checkForCyclesInGraphs(program);
  checkStreamOperations(program);
  return;
}

Assistant:

static void sanityCheck (const Program& program, const BuildSettings settings = {})
    {
        ignoreUnused (program.getMainProcessor());
        sanityCheckModules (program);
        sanityCheckAdvanceAndStreamCalls (program);
        checkConnections (program);
        checkForRecursiveFunctions (program, settings.maxStackSize);
        checkForInfiniteLoops (program);
        checkBlockParameters (program);
        checkForCyclesInGraphs (program);
        checkStreamOperations (program);
    }